

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_import(JSParseState *s)

{
  JSValue val;
  int iVar1;
  JSAtom JVar2;
  int iVar3;
  BOOL BVar4;
  JSParseState *in_RDI;
  int idx;
  int i;
  int first_import;
  JSAtom module_name;
  JSAtom import_name;
  JSAtom local_name;
  JSModuleDef *m;
  JSContext *ctx;
  undefined4 in_stack_ffffffffffffffc8;
  JSAtom in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd4;
  JSAtom in_stack_ffffffffffffffdc;
  JSContext *ctx_00;
  JSContext *ctx_01;
  JSAtom in_stack_fffffffffffffff8;
  JSAtom in_stack_fffffffffffffffc;
  
  ctx_01 = in_RDI->ctx;
  ctx_00 = (JSContext *)in_RDI->cur_func->module;
  iVar1 = next_token(s);
  if (iVar1 != 0) {
    return -1;
  }
  iVar1 = (int)(ctx_00->function_proto).tag;
  if ((in_RDI->token).val == -0x7f) {
    val.tag = (int64_t)_first_import;
    val.u.ptr = _idx;
    JVar2 = JS_ValueToAtom((JSContext *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),val);
    if (JVar2 == 0) {
      return -1;
    }
    iVar3 = next_token(s);
    if (iVar3 != 0) {
      JS_FreeAtom((JSContext *)CONCAT44(JVar2,iVar1),in_stack_ffffffffffffffcc);
      return -1;
    }
    goto LAB_0018dabb;
  }
  if ((in_RDI->token).val == -0x7d) {
    if ((in_RDI->token).u.ident.is_reserved != 0) {
      iVar1 = js_parse_error_reserved_identifier(_import_name);
      return iVar1;
    }
    in_stack_ffffffffffffffdc = JS_DupAtom(ctx_00,in_stack_ffffffffffffffdc);
    iVar3 = next_token(s);
    if ((iVar3 != 0) ||
       (iVar3 = add_import(_first_import,(JSModuleDef *)_idx,in_stack_fffffffffffffffc,
                           in_stack_fffffffffffffff8), iVar3 != 0)) goto LAB_0018d9cb;
    JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),in_stack_ffffffffffffffcc);
    if ((in_RDI->token).val == 0x2c) {
      iVar3 = next_token(s);
      if (iVar3 != 0) {
        return -1;
      }
      goto LAB_0018d7a8;
    }
  }
  else {
LAB_0018d7a8:
    if ((in_RDI->token).val == 0x2a) {
      iVar3 = next_token(s);
      if (iVar3 != 0) {
        return -1;
      }
      BVar4 = token_is_pseudo_keyword(in_RDI,0x79);
      if (BVar4 == 0) {
        iVar1 = js_parse_error(in_RDI,"expecting \'as\'");
        return iVar1;
      }
      iVar3 = next_token(s);
      if (iVar3 != 0) {
        return -1;
      }
      BVar4 = token_is_ident((in_RDI->token).val);
      if (BVar4 == 0) {
        js_parse_error(in_RDI,"identifier expected");
        return -1;
      }
      in_stack_ffffffffffffffdc = JS_DupAtom(ctx_00,in_stack_ffffffffffffffdc);
      iVar3 = next_token(s);
      if ((iVar3 != 0) ||
         (iVar3 = add_import(_first_import,(JSModuleDef *)_idx,in_stack_fffffffffffffffc,
                             in_stack_fffffffffffffff8), iVar3 != 0)) {
LAB_0018d9cb:
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),in_stack_ffffffffffffffcc
                   );
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),in_stack_ffffffffffffffcc
                   );
        return -1;
      }
      JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),in_stack_ffffffffffffffcc);
    }
    else if ((in_RDI->token).val == 0x7b) {
      iVar3 = next_token(s);
      if (iVar3 != 0) {
        return -1;
      }
      do {
        if ((in_RDI->token).val == 0x7d) {
LAB_0018da70:
          iVar3 = js_parse_expect((JSParseState *)
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
          if (iVar3 != 0) {
            return -1;
          }
          break;
        }
        BVar4 = token_is_ident((in_RDI->token).val);
        if (BVar4 == 0) {
          js_parse_error(in_RDI,"identifier expected");
          return -1;
        }
        JS_DupAtom(ctx_00,in_stack_ffffffffffffffdc);
        JVar2 = 0;
        iVar3 = next_token(s);
        if (iVar3 != 0) goto LAB_0018d9cb;
        BVar4 = token_is_pseudo_keyword(in_RDI,0x79);
        if (BVar4 == 0) {
          in_stack_ffffffffffffffdc = JS_DupAtom(ctx_00,JVar2);
        }
        else {
          iVar3 = next_token(s);
          if (iVar3 != 0) goto LAB_0018d9cb;
          BVar4 = token_is_ident((in_RDI->token).val);
          if (BVar4 == 0) {
            js_parse_error(in_RDI,"identifier expected");
            goto LAB_0018d9cb;
          }
          in_stack_ffffffffffffffdc = JS_DupAtom(ctx_00,JVar2);
          iVar3 = next_token(s);
          if (iVar3 != 0) goto LAB_0018d9cb;
        }
        iVar3 = add_import(_first_import,(JSModuleDef *)_idx,in_stack_fffffffffffffffc,
                           in_stack_fffffffffffffff8);
        if (iVar3 != 0) goto LAB_0018d9cb;
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),in_stack_ffffffffffffffcc
                   );
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),in_stack_ffffffffffffffcc
                   );
        if ((in_RDI->token).val != 0x2c) goto LAB_0018da70;
        iVar3 = next_token(s);
        if (iVar3 != 0) {
          return -1;
        }
      } while( true );
    }
  }
  JVar2 = js_parse_from_clause
                    ((JSParseState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (JVar2 == 0) {
    return -1;
  }
LAB_0018dabb:
  iVar3 = add_req_module_entry(ctx_01,(JSModuleDef *)ctx_00,in_stack_ffffffffffffffdc);
  JS_FreeAtom((JSContext *)CONCAT44(JVar2,iVar1),in_stack_ffffffffffffffcc);
  if (iVar3 < 0) {
    iVar1 = -1;
  }
  else {
    for (; iVar1 < (int)(ctx_00->function_proto).tag; iVar1 = iVar1 + 1) {
      *(int *)((long)(ctx_00->function_proto).u.ptr + (long)iVar1 * 0xc + 8) = iVar3;
    }
    iVar1 = js_parse_expect_semi((JSParseState *)CONCAT44(iVar1,iVar3));
  }
  return iVar1;
}

Assistant:

static __exception int js_parse_import(JSParseState *s)
{
    JSContext *ctx = s->ctx;
    JSModuleDef *m = s->cur_func->module;
    JSAtom local_name, import_name, module_name;
    int first_import, i, idx;

    if (next_token(s))
        return -1;

    first_import = m->import_entries_count;
    if (s->token.val == TOK_STRING) {
        module_name = JS_ValueToAtom(ctx, s->token.u.str.str);
        if (module_name == JS_ATOM_NULL)
            return -1;
        if (next_token(s)) {
            JS_FreeAtom(ctx, module_name);
            return -1;
        }
    } else {
        if (s->token.val == TOK_IDENT) {
            if (s->token.u.ident.is_reserved) {
                return js_parse_error_reserved_identifier(s);
            }
            /* "default" import */
            local_name = JS_DupAtom(ctx, s->token.u.ident.atom);
            import_name = JS_ATOM_default;
            if (next_token(s))
                goto fail;
            if (add_import(s, m, local_name, import_name))
                goto fail;
            JS_FreeAtom(ctx, local_name);

            if (s->token.val != ',')
                goto end_import_clause;
            if (next_token(s))
                return -1;
        }

        if (s->token.val == '*') {
            /* name space import */
            if (next_token(s))
                return -1;
            if (!token_is_pseudo_keyword(s, JS_ATOM_as))
                return js_parse_error(s, "expecting 'as'");
            if (next_token(s))
                return -1;
            if (!token_is_ident(s->token.val)) {
                js_parse_error(s, "identifier expected");
                return -1;
            }
            local_name = JS_DupAtom(ctx, s->token.u.ident.atom);
            import_name = JS_ATOM__star_;
            if (next_token(s))
                goto fail;
            if (add_import(s, m, local_name, import_name))
                goto fail;
            JS_FreeAtom(ctx, local_name);
        } else if (s->token.val == '{') {
            if (next_token(s))
                return -1;

            while (s->token.val != '}') {
                if (!token_is_ident(s->token.val)) {
                    js_parse_error(s, "identifier expected");
                    return -1;
                }
                import_name = JS_DupAtom(ctx, s->token.u.ident.atom);
                local_name = JS_ATOM_NULL;
                if (next_token(s))
                    goto fail;
                if (token_is_pseudo_keyword(s, JS_ATOM_as)) {
                    if (next_token(s))
                        goto fail;
                    if (!token_is_ident(s->token.val)) {
                        js_parse_error(s, "identifier expected");
                        goto fail;
                    }
                    local_name = JS_DupAtom(ctx, s->token.u.ident.atom);
                    if (next_token(s)) {
                    fail:
                        JS_FreeAtom(ctx, local_name);
                        JS_FreeAtom(ctx, import_name);
                        return -1;
                    }
                } else {
                    local_name = JS_DupAtom(ctx, import_name);
                }
                if (add_import(s, m, local_name, import_name))
                    goto fail;
                JS_FreeAtom(ctx, local_name);
                JS_FreeAtom(ctx, import_name);
                if (s->token.val != ',')
                    break;
                if (next_token(s))
                    return -1;
            }
            if (js_parse_expect(s, '}'))
                return -1;
        }
    end_import_clause:
        module_name = js_parse_from_clause(s);
        if (module_name == JS_ATOM_NULL)
            return -1;
    }
    idx = add_req_module_entry(ctx, m, module_name);
    JS_FreeAtom(ctx, module_name);
    if (idx < 0)
        return -1;
    for(i = first_import; i < m->import_entries_count; i++)
        m->import_entries[i].req_module_idx = idx;

    return js_parse_expect_semi(s);
}